

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_HasOwnPropScoped
               (Var scope,PropertyId propertyId,Var defaultInstance,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptArray *pJVar6;
  undefined4 extraout_var;
  
  if ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
      nullValue.ptr != (RecyclableObject *)scope) {
    bVar2 = JavascriptArray::IsNonES5Array(scope);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x712,
                                  "(scope == scriptContext->GetLibrary()->GetNull() || JavascriptArray::IsNonES5Array(scope))"
                                  ,"Invalid scope chain pointer passed - should be null or an array"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  pJVar6 = JavascriptArray::TryVarToNonES5Array(scope);
  if (pJVar6 != (JavascriptArray *)0x0) {
    iVar3 = (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pJVar6,0);
    defaultInstance = (Var)CONCAT44(extraout_var,iVar3);
  }
  BVar4 = OP_HasOwnProperty(defaultInstance,propertyId,scriptContext,(PropertyString *)0x0);
  return BVar4;
}

Assistant:

BOOL JavascriptOperators::OP_HasOwnPropScoped(Var scope, PropertyId propertyId, Var defaultInstance, ScriptContext* scriptContext)
    {
        AssertMsg(scope == scriptContext->GetLibrary()->GetNull() || JavascriptArray::IsNonES5Array(scope),
                  "Invalid scope chain pointer passed - should be null or an array");

        JavascriptArray* arrScope = JavascriptArray::TryVarToNonES5Array(scope);
        if (arrScope)
        {
            Var instance = arrScope->DirectGetItem(0);
            return JavascriptOperators::OP_HasOwnProperty(instance, propertyId, scriptContext);
        }
        return JavascriptOperators::OP_HasOwnProperty(defaultInstance, propertyId, scriptContext);
    }